

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItem
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  uint8 *puVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint32 tag;
  uint32 length;
  string temp;
  string message_data;
  StringOutputStream output_stream;
  CodedOutputStream coded_output;
  uint32 local_d4;
  undefined1 local_d0 [28];
  undefined8 local_b4;
  undefined2 local_ac;
  int local_a8;
  undefined8 local_a4;
  undefined8 uStack_9c;
  int local_94;
  DescriptorPool *local_90;
  MessageFactory *pMStack_88;
  string local_80;
  StringOutputStream local_60;
  CodedOutputStream local_50;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  tag = 0;
LAB_0020d1d2:
  do {
    puVar1 = input->buffer_;
    if ((puVar1 < input->buffer_end_) && (uVar4 = (uint)(char)*puVar1, -1 < (char)*puVar1)) {
      input->last_tag_ = uVar4;
      input->buffer_ = puVar1 + 1;
    }
    else {
      uVar4 = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = uVar4;
    }
    if (uVar4 == 0x1a) {
      if (tag == 0) {
        local_d0._0_8_ = local_d0 + 0x10;
        local_d0._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_d0._16_8_ = local_d0._16_8_ & 0xffffffffffffff00;
        bVar3 = io::CodedInputStream::ReadVarint32(input,&local_d4);
        if ((!bVar3) ||
           (bVar3 = io::CodedInputStream::ReadString(input,(string *)local_d0,local_d4), !bVar3)) {
          std::__cxx11::string::~string((string *)local_d0);
          goto LAB_0020d3b4;
        }
        io::StringOutputStream::StringOutputStream(&local_60,&local_80);
        io::CodedOutputStream::CodedOutputStream(&local_50,&local_60.super_ZeroCopyOutputStream);
        io::CodedOutputStream::WriteVarint32(&local_50,local_d4);
        io::CodedOutputStream::WriteString(&local_50,(string *)local_d0);
        io::CodedOutputStream::~CodedOutputStream(&local_50);
        io::StringOutputStream::~StringOutputStream(&local_60);
        std::__cxx11::string::~string((string *)local_d0);
        tag = 0;
        goto LAB_0020d1d2;
      }
      cVar2 = ParseField(this,tag,input,extension_finder,field_skipper);
    }
    else {
      if (uVar4 == 0) goto LAB_0020d3b4;
      if (uVar4 == 0xc) {
        bVar3 = true;
        goto LAB_0020d3b6;
      }
      if (uVar4 == 0x10) {
        bVar3 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_50);
        if (!bVar3) goto LAB_0020d3b4;
        tag = (int)local_50.output_ * 8 + 2;
        if (local_80._M_string_length != 0) {
          local_d0._0_8_ = (ZeroCopyInputStream *)0x0;
          local_d0._8_8_ = local_80._M_dataplus._M_p;
          local_d0._24_4_ = (undefined4)local_80._M_string_length;
          local_d0._16_8_ = local_80._M_dataplus._M_p + (int)local_d0._24_4_;
          local_ac._0_1_ = false;
          local_ac._1_1_ = false;
          local_b4._0_4_ = 0;
          local_b4._4_4_ = 0;
          local_a4._0_4_ = 0;
          local_a4._4_4_ = 0x4000000;
          uStack_9c._0_4_ = 0x2000000;
          uStack_9c._4_4_ = 0;
          local_94 = io::CodedInputStream::default_recursion_limit_;
          local_90 = (DescriptorPool *)0x0;
          pMStack_88 = (MessageFactory *)0x0;
          local_a8 = local_d0._24_4_;
          bVar3 = ParseField(this,tag,(CodedInputStream *)local_d0,extension_finder,field_skipper);
          if (!bVar3) {
            io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_d0);
            goto LAB_0020d3b4;
          }
          local_80._M_string_length = 0;
          *local_80._M_dataplus._M_p = '\0';
          io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_d0);
        }
        goto LAB_0020d1d2;
      }
      iVar5 = (*field_skipper->_vptr_FieldSkipper[2])(field_skipper,input,(ulong)uVar4);
      cVar2 = (char)iVar5;
    }
    if (cVar2 == '\0') {
LAB_0020d3b4:
      bVar3 = false;
LAB_0020d3b6:
      std::__cxx11::string::~string((string *)&local_80);
      return bVar3;
    }
  } while( true );
}

Assistant:

bool ExtensionSet::ParseMessageSetItem(io::CodedInputStream* input,
                                       ExtensionFinder* extension_finder,
                                       FieldSkipper* field_skipper) {
  // TODO(kenton):  It would be nice to share code between this and
  // WireFormatLite::ParseAndMergeMessageSetItem(), but I think the
  // differences would be hard to factor out.

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  // Once we see a type_id, we'll construct a fake tag for this extension
  // which is the tag it would have had under the proto2 extensions wire
  // format.
  uint32 fake_tag = 0;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        fake_tag = WireFormatLite::MakeTag(type_id,
            WireFormatLite::WIRETYPE_LENGTH_DELIMITED);

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::CodedInputStream sub_input(
              reinterpret_cast<const uint8*>(message_data.data()),
              message_data.size());
          if (!ParseFieldMaybeLazily(fake_tag, &sub_input,
                                     extension_finder, field_skipper)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (fake_tag == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseFieldMaybeLazily(fake_tag, input,
                                     extension_finder, field_skipper)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!field_skipper->SkipField(input, tag)) return false;
      }
    }
  }
}